

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int XMLDoc_parse_buffer_DOM_text_as_nodes
              (SXML_CHAR *buffer,SXML_CHAR *name,XMLDoc *doc,int text_as_nodes)

{
  int iVar1;
  size_t sVar2;
  DOM_through_SAX dom;
  SAX_Callbacks sax;
  
  iVar1 = 0;
  if ((buffer != (SXML_CHAR *)0x0 && doc != (XMLDoc *)0x0) && (doc->init_value == 0x19770522)) {
    dom.current = (XMLNode *)0x0;
    sax.start_doc = DOMXMLDoc_doc_start;
    sax.start_node = DOMXMLDoc_node_start;
    sax.end_node = DOMXMLDoc_node_end;
    sax.new_text = DOMXMLDoc_node_text;
    sax.on_error = DOMXMLDoc_parse_error;
    sax.end_doc = DOMXMLDoc_doc_end;
    sax.all_event = (_func_int_XMLEvent_XMLNode_ptr_SXML_CHAR_ptr_int_SAX_Data_ptr *)0x0;
    dom.doc = doc;
    dom.text_as_nodes = text_as_nodes;
    sVar2 = strlen(buffer);
    iVar1 = XMLDoc_parse_buffer_SAX_len(buffer,(int)sVar2,name,&sax,&dom);
    if (iVar1 == 0) {
      XMLDoc_free(doc);
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int XMLDoc_parse_buffer_DOM_text_as_nodes(const SXML_CHAR* buffer, const SXML_CHAR* name, XMLDoc* doc, int text_as_nodes)
{
	DOM_through_SAX dom;
	SAX_Callbacks sax;
	int ret;

	if (doc == NULL || buffer == NULL || doc->init_value != XML_INIT_DONE)
		return FALSE;

	dom.doc = doc;
	dom.current = NULL;
	dom.text_as_nodes = text_as_nodes;
	SAX_Callbacks_init_DOM(&sax);

	ret = XMLDoc_parse_buffer_SAX(buffer, name, &sax, &dom);
	if (!ret) {
		XMLDoc_free(doc);
		return ret;
	}

	/* TODO: Check there is no unfinished root nodes */
	return ret;
}